

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O0

int tx_elements_input_init
              (uchar *txhash,size_t txhash_len,uint32_t utxo_index,uint32_t sequence,uchar *script,
              size_t script_len,wally_tx_witness_stack *witness,uchar *nonce,size_t nonce_len,
              uchar *entropy,size_t entropy_len,uchar *issuance_amount,size_t issuance_amount_len,
              uchar *inflation_keys,size_t inflation_keys_len,uchar *issuance_amount_rangeproof,
              size_t issuance_amount_rangeproof_len,uchar *inflation_keys_rangeproof,
              size_t inflation_keys_rangeproof_len,wally_tx_witness_stack *pegin_witness,
              wally_tx_input *output,_Bool is_elements)

{
  uint8_t uVar1;
  _Bool _Var2;
  int iStack_84;
  _Bool is_coinbase;
  int old_features;
  int ret;
  uchar *new_script;
  wally_tx_witness_stack *new_pegin_witness;
  wally_tx_witness_stack *new_witness;
  size_t sStack_60;
  _Bool is_elements_local;
  size_t script_len_local;
  uchar *script_local;
  uint32_t sequence_local;
  uint32_t utxo_index_local;
  size_t txhash_len_local;
  uchar *txhash_local;
  
  new_witness._7_1_ = is_elements;
  new_pegin_witness = (wally_tx_witness_stack *)0x0;
  new_script = (uchar *)0x0;
  _old_features = (uchar *)0x0;
  iStack_84 = 0;
  if ((((txhash == (uchar *)0x0) || (txhash_len != 0x20)) ||
      ((script != (uchar *)0x0) != (script_len != 0))) || (output == (wally_tx_input *)0x0)) {
    txhash_local._4_4_ = -2;
  }
  else {
    uVar1 = output->features;
    sStack_60 = script_len;
    script_len_local = (size_t)script;
    script_local._0_4_ = sequence;
    script_local._4_4_ = utxo_index;
    _sequence_local = txhash_len;
    txhash_len_local = (size_t)txhash;
    if (witness != (wally_tx_witness_stack *)0x0) {
      iStack_84 = wally_tx_witness_stack_clone_alloc(witness,&new_pegin_witness);
    }
    if ((iStack_84 == 0) && (pegin_witness != (wally_tx_witness_stack *)0x0)) {
      iStack_84 = wally_tx_witness_stack_clone_alloc
                            (pegin_witness,(wally_tx_witness_stack **)&new_script);
    }
    if (iStack_84 == 0) {
      _Var2 = clone_bytes((uchar **)&old_features,(uchar *)script_len_local,sStack_60);
      if (!_Var2) {
        iStack_84 = -3;
      }
    }
    if (iStack_84 == 0) {
      output->features = '\0';
      iStack_84 = tx_elements_input_issuance_init
                            (output,nonce,nonce_len,entropy,entropy_len,issuance_amount,
                             issuance_amount_len,inflation_keys,inflation_keys_len,
                             issuance_amount_rangeproof,issuance_amount_rangeproof_len,
                             inflation_keys_rangeproof,inflation_keys_rangeproof_len,
                             (_Bool)(new_witness._7_1_ & 1));
    }
    if (iStack_84 == 0) {
      _Var2 = is_coinbase_bytes((uchar *)txhash_len_local,0x20,script_local._4_4_);
      *(undefined8 *)output->txhash = *(undefined8 *)txhash_len_local;
      *(undefined8 *)(output->txhash + 8) = *(undefined8 *)(txhash_len_local + 8);
      *(undefined8 *)(output->txhash + 0x10) = *(undefined8 *)(txhash_len_local + 0x10);
      *(undefined8 *)(output->txhash + 0x18) = *(undefined8 *)(txhash_len_local + 0x18);
      if (((new_witness._7_1_ & 1) == 0) || (_Var2)) {
        output->index = script_local._4_4_;
      }
      else {
        output->index = script_local._4_4_ & 0x3fffffff;
      }
      if ((((new_witness._7_1_ & 1) != 0) && (!_Var2)) && ((script_local._4_4_ & 0x40000000) != 0))
      {
        output->features = output->features | 4;
      }
      if (_Var2) {
        output->features = output->features | 8;
      }
      output->sequence = (uint32_t)script_local;
      output->script = _old_features;
      output->script_len = sStack_60;
      output->witness = new_pegin_witness;
      output->pegin_witness = (wally_tx_witness_stack *)new_script;
    }
    else {
      wally_tx_witness_stack_free(new_pegin_witness);
      wally_tx_witness_stack_free((wally_tx_witness_stack *)new_script);
      clear_and_free(_old_features,sStack_60);
      output->features = uVar1;
    }
    txhash_local._4_4_ = iStack_84;
  }
  return txhash_local._4_4_;
}

Assistant:

static int tx_elements_input_init(
    const unsigned char *txhash, size_t txhash_len,
    uint32_t utxo_index, uint32_t sequence,
    const unsigned char *script, size_t script_len,
    const struct wally_tx_witness_stack *witness,
    const unsigned char *nonce, size_t nonce_len,
    const unsigned char *entropy, size_t entropy_len,
    const unsigned char *issuance_amount, size_t issuance_amount_len,
    const unsigned char *inflation_keys, size_t inflation_keys_len,
    const unsigned char *issuance_amount_rangeproof, size_t issuance_amount_rangeproof_len,
    const unsigned char *inflation_keys_rangeproof, size_t inflation_keys_rangeproof_len,
    const struct wally_tx_witness_stack *pegin_witness,
    struct wally_tx_input *output, bool is_elements)
{
    struct wally_tx_witness_stack *new_witness = NULL;
    struct wally_tx_witness_stack *new_pegin_witness = NULL;
    unsigned char *new_script = NULL;
    int ret = WALLY_OK, old_features;

    if (!txhash || txhash_len != WALLY_TXHASH_LEN ||
        BYTES_INVALID(script, script_len) || !output)
        return WALLY_EINVAL;

    old_features = output->features;

    if (witness)
        ret = wally_tx_witness_stack_clone_alloc(witness, &new_witness);
    if (ret == WALLY_OK && pegin_witness)
        ret = wally_tx_witness_stack_clone_alloc(pegin_witness, &new_pegin_witness);
    if (ret == WALLY_OK && !clone_bytes(&new_script, script, script_len))
        ret = WALLY_ENOMEM;
    if (ret == WALLY_OK) {
        output->features = 0;
        ret = tx_elements_input_issuance_init(output,
                                              nonce,
                                              nonce_len,
                                              entropy,
                                              entropy_len,
                                              issuance_amount,
                                              issuance_amount_len,
                                              inflation_keys,
                                              inflation_keys_len,
                                              issuance_amount_rangeproof,
                                              issuance_amount_rangeproof_len,
                                              inflation_keys_rangeproof,
                                              inflation_keys_rangeproof_len,
                                              is_elements);
    }

    if (ret != WALLY_OK) {
        wally_tx_witness_stack_free(new_witness);
        wally_tx_witness_stack_free(new_pegin_witness);
        clear_and_free(new_script, script_len);
        output->features = old_features;
    } else {
        const bool is_coinbase = is_coinbase_bytes(txhash, WALLY_TXHASH_LEN, utxo_index);
        memcpy(output->txhash, txhash, WALLY_TXHASH_LEN);
        if (is_elements && !is_coinbase)
            output->index = utxo_index & WALLY_TX_INDEX_MASK;
        else
            output->index = utxo_index;
        if (is_elements && !is_coinbase && (utxo_index & WALLY_TX_PEGIN_FLAG))
            output->features |= WALLY_TX_IS_PEGIN;
        if (is_coinbase)
            output->features |= WALLY_TX_IS_COINBASE;
        output->sequence = sequence;
        output->script = new_script;
        output->script_len = script_len;
        output->witness = new_witness;
#ifdef BUILD_ELEMENTS
        output->pegin_witness = new_pegin_witness;
#endif /* BUILD_ELEMENTS */
    }
    return ret;
}